

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

Descriptor *
cfd::core::Descriptor::CreateDescriptor
          (Descriptor *__return_storage_ptr__,
          vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *type_list,
          vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
          *key_info_list,uint32_t require_num,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *this;
  bool bVar1;
  reference pDVar2;
  ulong uVar3;
  size_type sVar4;
  CfdException *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d2;
  allocator local_2d1;
  string local_2d0;
  CfdSourceLocation local_2b0;
  undefined1 local_292;
  allocator local_291;
  string local_290;
  CfdSourceLocation local_270;
  undefined1 local_252;
  allocator local_251;
  string local_250;
  CfdSourceLocation local_230;
  undefined1 local_212;
  allocator local_211;
  string local_210;
  CfdSourceLocation local_1f0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0;
  CfdSourceLocation local_1b0;
  DescriptorNodeScriptData *local_198;
  DescriptorNodeScriptData *node_data;
  DescriptorNodeScriptData *__end3;
  DescriptorNodeScriptData *__begin3;
  DescriptorNodeScriptData (*__range3) [11];
  DescriptorNodeScriptData *p_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  DescriptorKeyInfo *local_110;
  DescriptorKeyInfo *key_info;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *__range4;
  string key_text;
  undefined1 local_c8 [4];
  DescriptorScriptType type;
  undefined1 local_c0 [8];
  reverse_iterator ite;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> types;
  string output_descriptor;
  allocator local_69;
  string local_68;
  CfdSourceLocation local_48;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_30;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *pvStack_20;
  uint32_t require_num_local;
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
  *key_info_list_local;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
  *type_list_local;
  
  local_30 = network_parameters;
  network_parameters_local._4_4_ = require_num;
  pvStack_20 = key_info_list;
  key_info_list_local =
       (vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *)
       type_list;
  type_list_local =
       (vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> *)
       __return_storage_ptr__;
  bVar1 = ::std::
          vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          ::empty(type_list);
  if (bVar1) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x806;
    local_48.funcname = "CreateDescriptor";
    logger::warn<>(&local_48,"Failed to type list.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_68,"Failed to type list. list is empty.",&local_69);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_68);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::__cxx11::string::string
            ((string *)
             &types.
              super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  vector((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *)&ite,(vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                  *)key_info_list_local);
  ::std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  rbegin((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *)local_c0);
  do {
    ::std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
    ::rend((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
            *)local_c8);
    bVar1 = ::std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<cfd::core::DescriptorScriptType_*,_std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>_>_>
                               *)local_c0,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<cfd::core::DescriptorScriptType_*,_std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>_>_>
                               *)local_c8);
    if (!bVar1) {
      Parse(__return_storage_ptr__,
            (string *)
            &types.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_30);
      ::std::
      vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
      ~vector((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
               *)&ite);
      ::std::__cxx11::string::~string
                ((string *)
                 &types.
                  super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    pDVar2 = ::std::
             reverse_iterator<__gnu_cxx::__normal_iterator<cfd::core::DescriptorScriptType_*,_std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<cfd::core::DescriptorScriptType_*,_std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>_>_>
                          *)local_c0);
    key_text.field_2._12_4_ = *pDVar2;
    ::std::__cxx11::string::string((string *)&__range4);
    uVar3 = ::std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) &&
       (bVar1 = ::std::
                vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                ::empty(pvStack_20), this = pvStack_20, !bVar1)) {
      __end4 = ::std::
               vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>::
               begin(pvStack_20);
      key_info = (DescriptorKeyInfo *)
                 ::std::
                 vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                 ::end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_cfd::core::DescriptorKeyInfo_*,_std::vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>_>
                                         *)&key_info), bVar1) {
        local_110 = __gnu_cxx::
                    __normal_iterator<const_cfd::core::DescriptorKeyInfo_*,_std::vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>_>
                    ::operator*(&__end4);
        uVar3 = ::std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          DescriptorKeyInfo::ToString_abi_cxx11_((string *)&p_data,local_110);
          ::std::operator+(&local_150,",",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_data);
          ::std::__cxx11::string::operator+=((string *)&__range4,(string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_150);
          ::std::__cxx11::string::~string((string *)&p_data);
        }
        else {
          DescriptorKeyInfo::ToString_abi_cxx11_(&local_130,local_110);
          ::std::__cxx11::string::operator=((string *)&__range4,(string *)&local_130);
          ::std::__cxx11::string::~string((string *)&local_130);
        }
        __gnu_cxx::
        __normal_iterator<const_cfd::core::DescriptorKeyInfo_*,_std::vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>_>
        ::operator++(&__end4);
      }
    }
    __range3 = (DescriptorNodeScriptData (*) [11])0x0;
    __begin3 = (DescriptorNodeScriptData *)kDescriptorNodeScriptTable;
    node_data = (DescriptorNodeScriptData *)
                &DescriptorNode::GenerateChecksum(std::__cxx11::string_const&)::
                 kInputCharset_abi_cxx11_;
    for (__end3 = (DescriptorNodeScriptData *)kDescriptorNodeScriptTable;
        __end3 != (DescriptorNodeScriptData *)
                  &DescriptorNode::GenerateChecksum(std::__cxx11::string_const&)::
                   kInputCharset_abi_cxx11_; __end3 = __end3 + 1) {
      local_198 = __end3;
      if (key_text.field_2._12_4_ == __end3->type) {
        __range3 = (DescriptorNodeScriptData (*) [11])__end3;
        break;
      }
    }
    if (key_text.field_2._12_4_ == 0) {
LAB_0053df10:
      local_2b0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_2b0.filename = local_2b0.filename + 1;
      local_2b0.line = 0x849;
      local_2b0.funcname = "CreateDescriptor";
      logger::warn<>(&local_2b0,"Failed to script type.");
      local_2d2 = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_2d0,"Failed to script type. this type is unsupported.",&local_2d1)
      ;
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_2d0);
      local_2d2 = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (key_text.field_2._12_4_ - 1 < 2) {
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        local_270.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_270.filename = local_270.filename + 1;
        local_270.line = 0x83f;
        local_270.funcname = "CreateDescriptor";
        logger::warn<>(&local_270,"Failed to script hash type.");
        local_292 = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_290,
                   "Failed to script hash type. this type is unsupported of key.",&local_291);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_290);
        local_292 = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else {
      if (5 < key_text.field_2._12_4_ - 3) goto LAB_0053df10;
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_1b0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_1b0.filename = local_1b0.filename + 1;
        local_1b0.line = 0x82a;
        local_1b0.funcname = "CreateDescriptor";
        logger::warn<>(&local_1b0,"key hash type is bottom only.");
        local_1d2 = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_1d0,"Failed to createDescriptor. key hash type is bottom only.",
                   &local_1d1);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_1d0);
        local_1d2 = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        local_1f0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_1f0.filename = local_1f0.filename + 1;
        local_1f0.line = 0x830;
        local_1f0.funcname = "CreateDescriptor";
        logger::warn<>(&local_1f0,"key list is empty");
        local_212 = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_210,"Failed to createDescriptor. key list is empty.",&local_211)
        ;
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_210);
        local_212 = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if ((((*__range3)[0].multisig & 1U) == 0) &&
         (sVar4 = ::std::
                  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                  ::size(pvStack_20), 1 < sVar4)) {
        local_230.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_230.filename = local_230.filename + 1;
        local_230.line = 0x836;
        local_230.funcname = "CreateDescriptor";
        logger::warn<>(&local_230,"multiple key is multisig only.");
        local_252 = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_250,"Failed to createDescriptor. multiple key is multisig only."
                   ,&local_251);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_250);
        local_252 = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      if (((*__range3)[0].multisig & 1U) == 0) {
        ::std::operator+(&local_458,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __range3,"(");
        ::std::operator+(&local_438,&local_458,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range4);
        ::std::operator+(&local_418,&local_438,")");
        ::std::__cxx11::string::operator=
                  ((string *)
                   &types.
                    super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_418);
        ::std::__cxx11::string::~string((string *)&local_418);
        ::std::__cxx11::string::~string((string *)&local_438);
        ::std::__cxx11::string::~string((string *)&local_458);
      }
      else {
        ::std::operator+(&local_3d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __range3,"(");
        ::std::__cxx11::to_string(&local_3f8,network_parameters_local._4_4_);
        ::std::operator+(&local_3b8,&local_3d8,&local_3f8);
        ::std::operator+(&local_398,&local_3b8,",");
        ::std::operator+(&local_378,&local_398,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range4);
        ::std::operator+(&local_358,&local_378,")");
        ::std::__cxx11::string::operator=
                  ((string *)
                   &types.
                    super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_358);
        ::std::__cxx11::string::~string((string *)&local_358);
        ::std::__cxx11::string::~string((string *)&local_378);
        ::std::__cxx11::string::~string((string *)&local_398);
        ::std::__cxx11::string::~string((string *)&local_3b8);
        ::std::__cxx11::string::~string((string *)&local_3f8);
        ::std::__cxx11::string::~string((string *)&local_3d8);
      }
    }
    else {
      ::std::operator+(&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__range3
                       ,"(");
      ::std::operator+(&local_318,&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &types.
                        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::operator+(&local_2f8,&local_318,")");
      ::std::__cxx11::string::operator=
                ((string *)
                 &types.
                  super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_2f8);
      ::std::__cxx11::string::~string((string *)&local_2f8);
      ::std::__cxx11::string::~string((string *)&local_318);
      ::std::__cxx11::string::~string((string *)&local_338);
    }
    ::std::__cxx11::string::~string((string *)&__range4);
    ::std::
    reverse_iterator<__gnu_cxx::__normal_iterator<cfd::core::DescriptorScriptType_*,_std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<cfd::core::DescriptorScriptType_*,_std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>_>_>
                  *)local_c0);
  } while( true );
}

Assistant:

Descriptor Descriptor::CreateDescriptor(
    const std::vector<DescriptorScriptType>& type_list,
    const std::vector<DescriptorKeyInfo>& key_info_list, uint32_t require_num,
    const std::vector<AddressFormatData>* network_parameters) {
  if (type_list.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to type list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to type list. list is empty.");
  }
  std::string output_descriptor;
  std::vector<DescriptorScriptType> types(type_list);
  for (auto ite = types.rbegin(); ite != types.rend(); ++ite) {
    DescriptorScriptType type = *ite;

    std::string key_text;
    if (output_descriptor.empty() && (!key_info_list.empty())) {
      for (const auto& key_info : key_info_list) {
        if (key_text.empty()) {
          key_text = key_info.ToString();
        } else {
          key_text += "," + key_info.ToString();
        }
      }
    }

    const DescriptorNodeScriptData* p_data = nullptr;
    for (const auto& node_data : kDescriptorNodeScriptTable) {
      if (type == node_data.type) {
        p_data = &node_data;
        break;
      }
    }
    switch (type) {
      case DescriptorScriptType::kDescriptorScriptPk:
      case DescriptorScriptType::kDescriptorScriptPkh:
      case DescriptorScriptType::kDescriptorScriptWpkh:
      case DescriptorScriptType::kDescriptorScriptCombo:
      case DescriptorScriptType::kDescriptorScriptMulti:
      case DescriptorScriptType::kDescriptorScriptSortedMulti:
        if (!output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "key hash type is bottom only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key hash type is bottom only.");
        }
        if (key_text.empty()) {
          warn(CFD_LOG_SOURCE, "key list is empty");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key list is empty.");
        }
        if ((!p_data->multisig) && (key_info_list.size() > 1)) {
          warn(CFD_LOG_SOURCE, "multiple key is multisig only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. multiple key is multisig only.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptSh:
      case DescriptorScriptType::kDescriptorScriptWsh:
        if (output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "Failed to script hash type.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to script hash type. this type is unsupported of key.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptNull:
      case DescriptorScriptType::kDescriptorScriptAddr:
      case DescriptorScriptType::kDescriptorScriptRaw:
      default:
        warn(CFD_LOG_SOURCE, "Failed to script type.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to script type. this type is unsupported.");
        break;
    }

    if (key_text.empty()) {
      output_descriptor = p_data->name + "(" + output_descriptor + ")";
    } else if (p_data->multisig) {
      output_descriptor = p_data->name + "(" + std::to_string(require_num) +
                          "," + key_text + ")";
    } else {
      output_descriptor = p_data->name + "(" + key_text + ")";
    }
  }

  // Check descriptor script format.
  return Parse(output_descriptor, network_parameters);
}